

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_open(uv_loop_t *loop,uv_fs_t *req,char *path,int flags,int mode,uv_fs_cb cb)

{
  int iVar1;
  char *pcVar2;
  uv_fs_cb cb_local;
  int mode_local;
  int flags_local;
  char *path_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (req == (uv_fs_t *)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_OPEN;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if (path == (char *)0x0) {
      __assert_fail("path != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/fs.c"
                    ,0x7a9,
                    "int uv_fs_open(uv_loop_t *, uv_fs_t *, const char *, int, int, uv_fs_cb)");
    }
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
    }
    else {
      pcVar2 = uv__strdup(path);
      req->path = pcVar2;
      if (req->path == (char *)0x0) {
        return -0xc;
      }
    }
    req->flags = flags;
    req->mode = mode;
    if ((cb == (uv_fs_cb)0x0) || (iVar1 = uv__iou_fs_open(loop,req), iVar1 == 0)) {
      if (cb == (uv_fs_cb)0x0) {
        uv__fs_work(&req->work_req);
        loop_local._4_4_ = (int)req->result;
      }
      else {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
        loop_local._4_4_ = 0;
      }
    }
    else {
      loop_local._4_4_ = 0;
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_open(uv_loop_t* loop,
               uv_fs_t* req,
               const char* path,
               int flags,
               int mode,
               uv_fs_cb cb) {
  INIT(OPEN);
  PATH;
  req->flags = flags;
  req->mode = mode;
  if (cb != NULL)
    if (uv__iou_fs_open(loop, req))
      return 0;
  POST;
}